

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  int *piVar2;
  uint *puVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  int *piVar7;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  parasail_result_t *ppVar12;
  __m128i *ptr;
  int32_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  __m128i *palVar18;
  uint uVar19;
  ulong size;
  __m128i *palVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  int32_t iVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  uint uVar31;
  uint uVar36;
  uint uVar37;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  uint uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  uint uVar42;
  uint uVar44;
  uint uVar45;
  undefined1 auVar43 [16];
  uint uVar46;
  ulong uVar47;
  undefined1 auVar48 [16];
  int iVar52;
  int iVar53;
  undefined1 auVar49 [16];
  int iVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar61;
  int iVar64;
  int iVar65;
  undefined1 in_XMM11 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar66;
  int iVar67;
  uint uVar69;
  int iVar70;
  uint uVar71;
  int iVar72;
  undefined1 auVar68 [16];
  uint uVar73;
  int iVar74;
  int iVar75;
  int iVar77;
  int iVar78;
  __m128i alVar76;
  int iVar79;
  undefined1 in_XMM14 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar82 [16];
  int local_d4;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_scan_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_table_scan_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_scan_profile_sse41_128_32_cold_6();
      }
      else {
        uVar22 = (ulong)(uint)s2Len;
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          parasail_sg_flags_table_scan_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_scan_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_table_scan_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_table_scan_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_table_scan_profile_sse41_128_32_cold_1();
        }
        else {
          uVar10 = uVar4 - 1;
          uVar47 = (ulong)uVar4 + 3;
          size = uVar47 >> 2;
          uVar8 = (ulong)uVar10 % size;
          iVar15 = (int)(uVar10 / size);
          iVar29 = -open;
          iVar13 = ppVar6->min;
          uVar28 = 0x80000000 - iVar13;
          if (iVar13 != iVar29 && SBORROW4(iVar13,iVar29) == iVar13 + open < 0) {
            uVar28 = open | 0x80000000;
          }
          uVar11 = 0x7ffffffe - ppVar6->max;
          ppVar12 = parasail_result_new_table1((uint)uVar47 & 0x7ffffffc,s2Len);
          if (ppVar12 != (parasail_result_t *)0x0) {
            ppVar12->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar12->flag | 0x4420402;
            ptr = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,size);
            ptr_02 = parasail_memalign___m128i(0x10,size);
            ptr_03 = parasail_memalign___m128i(0x10,size);
            if (ptr_03 != (__m128i *)0x0 &&
                ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                (ptr_00 != (int32_t *)0x0 && ptr != (__m128i *)0x0))) {
              iVar13 = s2Len + -1;
              uVar27 = 3 - iVar15;
              uVar28 = uVar28 + 1;
              auVar39._4_4_ = uVar28;
              auVar39._0_4_ = uVar28;
              auVar39._8_4_ = uVar28;
              auVar39._12_4_ = uVar28;
              auVar43._4_4_ = uVar11;
              auVar43._0_4_ = uVar11;
              auVar43._8_4_ = uVar11;
              auVar43._12_4_ = uVar11;
              uVar23 = (uint)size;
              iVar14 = -(uVar23 * gap);
              auVar49._4_4_ = iVar29;
              auVar49._0_4_ = iVar29;
              auVar49._8_4_ = iVar29;
              auVar49._12_4_ = iVar29;
              auVar55._0_8_ = CONCAT44(0,open);
              auVar55._8_4_ = open;
              auVar55._12_4_ = 0;
              auVar59._8_4_ = uVar23;
              auVar59._0_8_ = size;
              auVar59._12_4_ = 0;
              auVar62 = pmovsxbq(in_XMM11,0x302);
              auVar62 = pmuldq(auVar62,auVar59);
              auVar59 = pmuldq(auVar59,_DAT_00903a90);
              uVar16 = 0;
              auVar43 = pmovsxdq(auVar43,0x8000000080000000);
              palVar18 = ptr_02;
              palVar20 = ptr;
              do {
                if (s1_beg == 0) {
                  auVar82._8_4_ = (int)uVar16;
                  auVar82._0_8_ = uVar16;
                  auVar82._12_4_ = (int)(uVar16 >> 0x20);
                  auVar32._0_4_ = (undefined4)(uVar16 + auVar59._0_8_);
                  auVar32._4_4_ = (int)(auVar82._8_8_ + auVar59._8_8_);
                  auVar32._8_4_ = (int)(auVar62._0_8_ + uVar16);
                  auVar32._12_4_ = (int)(auVar62._8_8_ + auVar82._8_8_);
                  auVar80._4_4_ = gap;
                  auVar80._0_4_ = gap;
                  auVar80._8_4_ = gap;
                  auVar80._12_4_ = gap;
                  auVar80 = pmulld(auVar32,auVar80);
                  alVar76[0]._0_4_ = iVar29 - auVar80._0_4_;
                  alVar76[0]._4_4_ = iVar29 - auVar80._4_4_;
                  alVar76[1]._0_4_ = iVar29 - auVar80._8_4_;
                  alVar76[1]._4_4_ = iVar29 - auVar80._12_4_;
                }
                else {
                  alVar76[0] = 0;
                  alVar76[1] = 0;
                }
                auVar80 = pmovsxdq(in_XMM14,(undefined1  [16])alVar76);
                auVar33._0_8_ = alVar76[1];
                auVar33._8_4_ = (int)alVar76[1];
                auVar33._12_4_ = alVar76[1]._4_4_;
                auVar82 = pmovsxdq(in_XMM15,auVar33);
                in_XMM15._0_8_ = auVar82._0_8_ - auVar55._0_8_;
                in_XMM15._8_8_ = auVar82._8_8_ - (ulong)(uint)open;
                auVar81._0_8_ = auVar80._0_8_ - auVar55._0_8_;
                auVar81._8_8_ = auVar80._8_8_ - (ulong)(uint)open;
                auVar34._0_8_ = -(ulong)(auVar43._0_8_ < auVar81._0_8_);
                auVar34._8_8_ = -(ulong)(auVar43._8_8_ < auVar81._8_8_);
                auVar80 = blendvpd(auVar43,auVar81,auVar34);
                auVar35._0_8_ = -(ulong)(auVar43._0_8_ < in_XMM15._0_8_);
                auVar35._8_8_ = -(ulong)(auVar43._8_8_ < in_XMM15._8_8_);
                in_XMM14 = blendvpd(auVar43,in_XMM15,auVar35);
                *palVar18 = alVar76;
                *(int *)*palVar20 = auVar80._0_4_;
                *(int *)((long)*palVar20 + 4) = auVar80._8_4_;
                *(int *)(*palVar20 + 1) = in_XMM14._0_4_;
                *(int *)((long)*palVar20 + 0xc) = in_XMM14._8_4_;
                uVar16 = uVar16 + 1;
                palVar20 = palVar20 + 1;
                palVar18 = palVar18 + 1;
              } while (size != uVar16);
              *ptr_00 = 0;
              auVar43 = _DAT_00906ca0;
              lVar17 = uVar22 - 1;
              auVar62._8_4_ = (int)lVar17;
              auVar62._0_8_ = lVar17;
              auVar62._12_4_ = (int)((ulong)lVar17 >> 0x20);
              iVar52 = 0;
              auVar49 = pmovsxbq(auVar49,0x302);
              auVar55 = pmovsxbq(auVar55,0x100);
              auVar62 = auVar62 ^ _DAT_00906ca0;
              uVar16 = 0;
              do {
                uVar26 = auVar43._0_8_;
                lVar17 = auVar62._0_8_;
                if ((bool)(~(lVar17 < (long)(uVar16 ^ uVar26)) & 1)) {
                  iVar25 = 0;
                  if (s2_beg == 0) {
                    iVar25 = iVar29;
                  }
                  ptr_00[uVar16 + 1] = iVar25;
                }
                auVar68._8_4_ = (int)uVar16;
                auVar68._0_8_ = uVar16;
                auVar68._12_4_ = (int)(uVar16 >> 0x20);
                if ((long)((auVar68._8_8_ | auVar55._8_8_) ^ auVar43._8_8_) <= auVar62._8_8_) {
                  iVar53 = iVar29 - gap;
                  if (s2_beg != 0) {
                    iVar53 = iVar52;
                  }
                  ptr_00[uVar16 + 2] = iVar53;
                }
                bVar9 = (long)((uVar16 | auVar49._0_8_) ^ uVar26) <= lVar17;
                if (bVar9) {
                  iVar53 = gap * -2 + iVar29;
                  if (s2_beg != 0) {
                    iVar53 = iVar52;
                  }
                  ptr_00[uVar16 + 3] = iVar53;
                }
                if (bVar9) {
                  iVar53 = gap * -3 + iVar29;
                  if (s2_beg != 0) {
                    iVar53 = iVar52;
                  }
                  ptr_00[uVar16 + 4] = iVar53;
                }
                uVar16 = uVar16 + 4;
                iVar29 = iVar29 + gap * -4;
              } while ((s2Len + 3U & 0xfffffffc) != uVar16);
              iVar29 = -open;
              iVar52 = -open;
              iVar53 = -open;
              iVar54 = -open;
              palVar18 = ptr_03 + (uVar23 - 1);
              uVar16 = size;
              uVar31 = uVar11;
              uVar36 = uVar11;
              uVar37 = uVar11;
              uVar38 = uVar11;
              do {
                *(int *)*palVar18 = iVar29;
                *(int *)((long)*palVar18 + 4) = iVar52;
                *(int *)(*palVar18 + 1) = iVar53;
                *(int *)((long)*palVar18 + 0xc) = iVar54;
                iVar29 = iVar29 - gap;
                iVar52 = iVar52 - gap;
                iVar53 = iVar53 - gap;
                iVar54 = iVar54 - gap;
                uVar31 = (uint)(iVar29 < (int)uVar31) * iVar29 | (iVar29 >= (int)uVar31) * uVar31;
                uVar36 = (uint)(iVar52 < (int)uVar36) * iVar52 | (iVar52 >= (int)uVar36) * uVar36;
                uVar37 = (uint)(iVar53 < (int)uVar37) * iVar53 | (iVar53 >= (int)uVar37) * uVar37;
                uVar38 = (uint)(iVar54 < (int)uVar38) * iVar54 | (iVar54 >= (int)uVar38) * uVar38;
                palVar18 = palVar18 + -1;
                iVar61 = (int)uVar16;
                uVar19 = iVar61 - 1;
                uVar16 = (ulong)uVar19;
              } while (uVar19 != 0 && 0 < iVar61);
              palVar18 = ptr_02 + (uVar23 - 1);
              palVar20 = ptr_02 + uVar8;
              lVar30 = size * uVar22;
              uVar16 = lVar30 * 0xc;
              lVar17 = 0;
              auVar48._0_4_ = -(uint)(uVar27 == 3);
              auVar48._4_4_ = -(uint)(uVar27 == 2);
              auVar48._8_4_ = -(uint)(uVar27 == 1);
              auVar48._12_4_ = -(uint)(uVar27 == 0);
              uVar26 = 0;
              auVar50 = auVar39;
              auVar56 = auVar39;
              local_d4 = iVar13;
              do {
                iVar29 = ppVar6->mapper[(byte)s2[uVar26]];
                uVar19 = uVar28 - (int)(*ptr_03)[0];
                uVar69 = uVar28 - *(int *)((long)*ptr_03 + 4);
                uVar71 = uVar28 - (int)(*ptr_03)[1];
                uVar73 = uVar28 - *(int *)((long)*ptr_03 + 0xc);
                lVar21 = 0;
                auVar43 = auVar39;
                iVar25 = ptr_00[uVar26];
                iVar52 = (int)(*palVar18)[0];
                iVar53 = *(int *)((long)*palVar18 + 4);
                iVar54 = (int)(*palVar18)[1];
                do {
                  piVar7 = (int *)((long)*ptr_02 + lVar21);
                  iVar61 = *piVar7;
                  iVar64 = piVar7[1];
                  iVar65 = piVar7[2];
                  iVar66 = piVar7[3];
                  piVar7 = (int *)((long)*ptr + lVar21);
                  piVar2 = (int *)((long)pvVar5 + lVar21 + (long)iVar29 * size * 0x10);
                  iVar58 = iVar25 + *piVar2;
                  iVar52 = iVar52 + piVar2[1];
                  iVar53 = iVar53 + piVar2[2];
                  iVar54 = iVar54 + piVar2[3];
                  piVar2 = (int *)((long)*ptr_03 + lVar21);
                  iVar67 = uVar19 + *piVar2;
                  iVar70 = uVar69 + piVar2[1];
                  iVar72 = uVar71 + piVar2[2];
                  iVar74 = uVar73 + piVar2[3];
                  iVar75 = *piVar7 - gap;
                  iVar77 = piVar7[1] - gap;
                  iVar78 = piVar7[2] - gap;
                  iVar79 = piVar7[3] - gap;
                  iVar41 = auVar43._0_4_;
                  auVar63._0_4_ =
                       (uint)(iVar41 < iVar67) * iVar67 | (uint)(iVar41 >= iVar67) * iVar41;
                  iVar41 = auVar43._4_4_;
                  auVar63._4_4_ =
                       (uint)(iVar41 < iVar70) * iVar70 | (uint)(iVar41 >= iVar70) * iVar41;
                  iVar41 = auVar43._8_4_;
                  iVar67 = auVar43._12_4_;
                  auVar63._8_4_ =
                       (uint)(iVar41 < iVar72) * iVar72 | (uint)(iVar41 >= iVar72) * iVar41;
                  auVar63._12_4_ =
                       (uint)(iVar67 < iVar74) * iVar74 | (uint)(iVar67 >= iVar74) * iVar67;
                  iVar41 = iVar61 - open;
                  iVar67 = iVar64 - open;
                  iVar70 = iVar65 - open;
                  iVar72 = iVar66 - open;
                  uVar42 = (uint)(iVar41 < iVar75) * iVar75 | (uint)(iVar41 >= iVar75) * iVar41;
                  uVar44 = (uint)(iVar67 < iVar77) * iVar77 | (uint)(iVar67 >= iVar77) * iVar67;
                  uVar45 = (uint)(iVar70 < iVar78) * iVar78 | (uint)(iVar70 >= iVar78) * iVar70;
                  uVar46 = (uint)(iVar72 < iVar79) * iVar79 | (uint)(iVar72 >= iVar79) * iVar72;
                  uVar19 = (iVar58 < (int)uVar42) * uVar42 | (uint)(iVar58 >= (int)uVar42) * iVar58;
                  uVar69 = (iVar52 < (int)uVar44) * uVar44 | (uint)(iVar52 >= (int)uVar44) * iVar52;
                  uVar71 = (iVar53 < (int)uVar45) * uVar45 | (uint)(iVar53 >= (int)uVar45) * iVar53;
                  uVar73 = (iVar54 < (int)uVar46) * uVar46 | (uint)(iVar54 >= (int)uVar46) * iVar54;
                  puVar3 = (uint *)((long)*ptr + lVar21);
                  *puVar3 = uVar42;
                  puVar3[1] = uVar44;
                  puVar3[2] = uVar45;
                  puVar3[3] = uVar46;
                  puVar3 = (uint *)((long)*ptr_01 + lVar21);
                  *puVar3 = uVar19;
                  puVar3[1] = uVar69;
                  puVar3[2] = uVar71;
                  puVar3[3] = uVar73;
                  lVar21 = lVar21 + 0x10;
                  auVar43 = auVar63;
                  iVar25 = iVar61;
                  iVar52 = iVar64;
                  iVar53 = iVar65;
                  iVar54 = iVar66;
                } while (size << 4 != lVar21);
                uVar1 = uVar26 + 1;
                iVar29 = ptr_00[uVar26 + 1];
                iVar52 = (int)(*ptr_03)[0] + iVar29;
                iVar53 = *(int *)((long)*ptr_03 + 4) + uVar19;
                iVar54 = (int)(*ptr_03)[1] + uVar69;
                uVar73 = (uint)((int)auVar63._0_4_ < iVar52) * iVar52 |
                         ((int)auVar63._0_4_ >= iVar52) * auVar63._0_4_;
                uVar42 = (uint)((int)auVar63._4_4_ < iVar53) * iVar53 |
                         ((int)auVar63._4_4_ >= iVar53) * auVar63._4_4_;
                uVar44 = (uint)((int)auVar63._8_4_ < iVar54) * iVar54 |
                         ((int)auVar63._8_4_ >= iVar54) * auVar63._8_4_;
                iVar52 = uVar73 + iVar14;
                iVar53 = uVar42 + iVar14;
                uVar73 = ((int)uVar28 < (int)uVar73) * uVar73 |
                         ((int)uVar28 >= (int)uVar73) * uVar28;
                uVar42 = (iVar52 < (int)uVar42) * uVar42 | (uint)(iVar52 >= (int)uVar42) * iVar52;
                uVar44 = (iVar53 < (int)uVar44) * uVar44 | (uint)(iVar53 >= (int)uVar44) * iVar53;
                iVar52 = uVar73 + iVar14;
                iVar53 = uVar42 + iVar14;
                uVar45 = ((int)uVar28 < (int)uVar73) * uVar73 |
                         ((int)uVar28 >= (int)uVar73) * uVar28;
                uVar46 = (iVar52 < (int)uVar42) * uVar42 | (uint)(iVar52 >= (int)uVar42) * iVar52;
                uVar44 = (iVar53 < (int)uVar44) * uVar44 | (uint)(iVar53 >= (int)uVar44) * iVar53;
                uVar73 = (iVar29 < (int)uVar28) * uVar28 | (uint)(iVar29 >= (int)uVar28) * iVar29;
                uVar42 = ((int)uVar19 < (int)uVar45) * uVar45 |
                         ((int)uVar19 >= (int)uVar45) * uVar19;
                uVar69 = ((int)uVar69 < (int)uVar46) * uVar46 |
                         ((int)uVar69 >= (int)uVar46) * uVar69;
                uVar71 = ((int)uVar71 < (int)uVar44) * uVar44 |
                         ((int)uVar71 >= (int)uVar44) * uVar71;
                lVar24 = 0;
                lVar21 = lVar17;
                auVar43 = auVar50;
                uVar19 = uVar28;
                do {
                  iVar61 = uVar19 - gap;
                  iVar64 = uVar45 - gap;
                  iVar65 = uVar46 - gap;
                  iVar66 = uVar44 - gap;
                  iVar29 = uVar73 - open;
                  iVar52 = uVar42 - open;
                  iVar53 = uVar69 - open;
                  iVar54 = uVar71 - open;
                  uVar19 = (uint)(iVar61 < iVar29) * iVar29 | (uint)(iVar61 >= iVar29) * iVar61;
                  uVar45 = (uint)(iVar64 < iVar52) * iVar52 | (uint)(iVar64 >= iVar52) * iVar64;
                  uVar46 = (uint)(iVar65 < iVar53) * iVar53 | (uint)(iVar65 >= iVar53) * iVar65;
                  uVar44 = (uint)(iVar66 < iVar54) * iVar54 | (uint)(iVar66 >= iVar54) * iVar66;
                  piVar7 = (int *)((long)*ptr_01 + lVar24);
                  iVar29 = *piVar7;
                  iVar52 = piVar7[1];
                  iVar53 = piVar7[2];
                  iVar54 = piVar7[3];
                  uVar73 = (iVar29 < (int)uVar19) * uVar19 | (uint)(iVar29 >= (int)uVar19) * iVar29;
                  uVar42 = (iVar52 < (int)uVar45) * uVar45 | (uint)(iVar52 >= (int)uVar45) * iVar52;
                  uVar69 = (iVar53 < (int)uVar46) * uVar46 | (uint)(iVar53 >= (int)uVar46) * iVar53;
                  uVar71 = (iVar54 < (int)uVar44) * uVar44 | (uint)(iVar54 >= (int)uVar44) * iVar54;
                  puVar3 = (uint *)((long)*ptr_02 + lVar24);
                  *puVar3 = uVar73;
                  puVar3[1] = uVar42;
                  puVar3[2] = uVar69;
                  puVar3[3] = uVar71;
                  uVar31 = ((int)uVar19 < (int)uVar31) * uVar19 |
                           ((int)uVar19 >= (int)uVar31) * uVar31;
                  uVar36 = ((int)uVar45 < (int)uVar36) * uVar45 |
                           ((int)uVar45 >= (int)uVar36) * uVar36;
                  uVar37 = ((int)uVar46 < (int)uVar37) * uVar46 |
                           ((int)uVar46 >= (int)uVar37) * uVar37;
                  uVar38 = ((int)uVar44 < (int)uVar38) * uVar44 |
                           ((int)uVar44 >= (int)uVar38) * uVar38;
                  uVar31 = ((int)uVar73 < (int)uVar31) * uVar73 |
                           ((int)uVar73 >= (int)uVar31) * uVar31;
                  uVar36 = ((int)uVar42 < (int)uVar36) * uVar42 |
                           ((int)uVar42 >= (int)uVar36) * uVar36;
                  uVar37 = ((int)uVar69 < (int)uVar37) * uVar69 |
                           ((int)uVar69 >= (int)uVar37) * uVar37;
                  uVar38 = ((int)uVar71 < (int)uVar38) * uVar71 |
                           ((int)uVar71 >= (int)uVar38) * uVar38;
                  piVar7 = ((ppVar12->field_4).rowcols)->score_row;
                  *(uint *)((long)piVar7 + lVar21) = uVar73;
                  *(uint *)((long)piVar7 + lVar30 * 4 + lVar21) = uVar42;
                  *(uint *)((long)piVar7 + lVar30 * 8 + lVar21) = uVar69;
                  *(uint *)((long)piVar7 + uVar16 + lVar21) = uVar71;
                  iVar29 = auVar43._0_4_;
                  auVar50._0_4_ =
                       (iVar29 < (int)uVar73) * uVar73 | (uint)(iVar29 >= (int)uVar73) * iVar29;
                  iVar29 = auVar43._4_4_;
                  auVar50._4_4_ =
                       (iVar29 < (int)uVar42) * uVar42 | (uint)(iVar29 >= (int)uVar42) * iVar29;
                  iVar29 = auVar43._8_4_;
                  iVar52 = auVar43._12_4_;
                  auVar50._8_4_ =
                       (iVar29 < (int)uVar69) * uVar69 | (uint)(iVar29 >= (int)uVar69) * iVar29;
                  auVar50._12_4_ =
                       (iVar52 < (int)uVar71) * uVar71 | (uint)(iVar52 >= (int)uVar71) * iVar52;
                  lVar24 = lVar24 + 0x10;
                  lVar21 = lVar21 + uVar22 * 4;
                  auVar43 = auVar50;
                } while (size << 4 != lVar24);
                iVar29 = (int)(*palVar20)[0];
                iVar52 = *(int *)((long)*palVar20 + 4);
                iVar53 = (int)(*palVar20)[1];
                iVar54 = *(int *)((long)*palVar20 + 0xc);
                iVar64 = auVar56._0_4_;
                auVar60._0_4_ = -(uint)(iVar64 < iVar29);
                iVar65 = auVar56._4_4_;
                auVar60._4_4_ = -(uint)(iVar65 < iVar52);
                iVar66 = auVar56._8_4_;
                auVar60._8_4_ = -(uint)(iVar66 < iVar53);
                iVar41 = auVar56._12_4_;
                auVar60._12_4_ = -(uint)(iVar41 < iVar54);
                iVar61 = movmskps((int)palVar20,auVar60 & auVar48);
                if (iVar61 != 0) {
                  local_d4 = (int)uVar26;
                }
                auVar56._0_4_ = (uint)(iVar64 < iVar29) * iVar29 | (uint)(iVar64 >= iVar29) * iVar64
                ;
                auVar56._4_4_ = (uint)(iVar65 < iVar52) * iVar52 | (uint)(iVar65 >= iVar52) * iVar65
                ;
                auVar56._8_4_ = (uint)(iVar66 < iVar53) * iVar53 | (uint)(iVar66 >= iVar53) * iVar66
                ;
                auVar56._12_4_ =
                     (uint)(iVar41 < iVar54) * iVar54 | (uint)(iVar41 >= iVar54) * iVar41;
                lVar17 = lVar17 + 4;
                uVar26 = uVar1;
              } while (uVar1 != uVar22);
              uVar19 = uVar28;
              if ((s2_end != 0) && (uVar19 = auVar56._12_4_, iVar15 < 3)) {
                iVar29 = 0;
                uVar16 = (ulong)uVar27;
                do {
                  auVar57._0_8_ = auVar56._0_8_ << 0x20;
                  auVar57._8_8_ = auVar56._8_8_ << 0x20 | auVar56._0_8_ >> 0x20;
                  uVar19 = auVar56._8_4_;
                  iVar29 = iVar29 + 1;
                  auVar56 = auVar57;
                } while (iVar29 < (int)uVar27);
              }
              uVar71 = (uint)uVar16;
              uVar69 = uVar10;
              if ((s1_end != 0) && ((uVar47 & 0x7ffffffc) != 0)) {
                uVar71 = (uVar23 & 0x1fffffff) << 2;
                uVar22 = 0;
                do {
                  uVar73 = ((uint)uVar22 & 3) * uVar23 + ((uint)(uVar22 >> 2) & 0x3fffffff);
                  uVar42 = uVar19;
                  uVar44 = uVar69;
                  iVar29 = local_d4;
                  if (((int)uVar73 < (int)uVar4) &&
                     (uVar45 = *(uint *)((long)*ptr_02 + uVar22 * 4), uVar42 = uVar45,
                     uVar44 = uVar73, iVar29 = iVar13, (int)uVar45 <= (int)uVar19)) {
                    if ((int)uVar69 <= (int)uVar73) {
                      uVar73 = uVar69;
                    }
                    uVar42 = uVar19;
                    uVar44 = uVar69;
                    iVar29 = local_d4;
                    if (local_d4 == iVar13 && uVar45 == uVar19) {
                      uVar44 = uVar73;
                    }
                  }
                  local_d4 = iVar29;
                  uVar69 = uVar44;
                  uVar19 = uVar42;
                  uVar22 = uVar22 + 1;
                } while (uVar71 != (uint)uVar22);
              }
              if (s2_end == 0 && s1_end == 0) {
                uVar22 = ptr_02[uVar8][1];
                if (iVar15 < 3) {
                  iVar15 = 0;
                  uVar47 = ptr_02[uVar8][0];
                  do {
                    uVar22 = uVar22 << 0x20 | uVar47 >> 0x20;
                    iVar15 = iVar15 + 1;
                    uVar71 = uVar27;
                    uVar47 = uVar47 << 0x20;
                  } while (iVar15 < (int)uVar27);
                }
                uVar19 = (uint)(uVar22 >> 0x20);
                uVar69 = uVar10;
                local_d4 = iVar13;
              }
              auVar40._0_4_ = -(uint)((int)uVar31 < (int)uVar28);
              auVar40._4_4_ = -(uint)((int)uVar36 < (int)uVar28);
              auVar40._8_4_ = -(uint)((int)uVar37 < (int)uVar28);
              auVar40._12_4_ = -(uint)((int)uVar38 < (int)uVar28);
              auVar51._0_4_ = -(uint)((int)uVar11 < (int)auVar50._0_4_);
              auVar51._4_4_ = -(uint)((int)uVar11 < (int)auVar50._4_4_);
              auVar51._8_4_ = -(uint)((int)uVar11 < (int)auVar50._8_4_);
              auVar51._12_4_ = -(uint)((int)uVar11 < (int)auVar50._12_4_);
              iVar13 = movmskps(uVar71,auVar51 | auVar40);
              if (iVar13 != 0) {
                *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                uVar19 = 0;
                local_d4 = 0;
                uVar69 = 0;
              }
              ppVar12->score = uVar19;
              ppVar12->end_query = uVar69;
              ppVar12->end_ref = local_d4;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar12;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32 (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}